

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigTests.cpp
# Opt level: O2

vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> * __thiscall
deqp::egl::ChooseConfigRandomCase::genRandomAttributes
          (vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
           *__return_storage_ptr__,ChooseConfigRandomCase *this,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *attribSet,
          int numAttribs,Random *rnd)

{
  value_type *__x;
  EGLint EVar1;
  const_iterator cVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  AttribSpec AVar6;
  vector<deqp::egl::ChooseConfigRandomCase::AttribSpec,_std::allocator<deqp::egl::ChooseConfigRandomCase::AttribSpec>_>
  candidates;
  _Vector_base<deqp::egl::ChooseConfigRandomCase::AttribSpec,_std::allocator<deqp::egl::ChooseConfigRandomCase::AttribSpec>_>
  local_58;
  pair<unsigned_int,_int> local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (AttribSpec *)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (AttribSpec *)0x0;
  for (lVar4 = 0; lVar4 != 0x160; lVar4 = lVar4 + 0x10) {
    __x = (value_type *)((long)&genRandomAttributes::attributes[0].attribute + lVar4);
    cVar2 = std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::find(&attribSet->_M_t,(key_type *)__x);
    if ((_Rb_tree_header *)cVar2._M_node != &(attribSet->_M_t)._M_impl.super__Rb_tree_header) {
      std::
      vector<deqp::egl::ChooseConfigRandomCase::AttribSpec,_std::allocator<deqp::egl::ChooseConfigRandomCase::AttribSpec>_>
      ::push_back((vector<deqp::egl::ChooseConfigRandomCase::AttribSpec,_std::allocator<deqp::egl::ChooseConfigRandomCase::AttribSpec>_>
                   *)&local_58,__x);
    }
  }
  iVar3 = 0;
  if (0 < numAttribs) {
    iVar3 = numAttribs;
  }
  while (bVar5 = iVar3 != 0, iVar3 = iVar3 + -1, bVar5) {
    AVar6 = de::Random::
            choose<deqp::egl::ChooseConfigRandomCase::AttribSpec,__gnu_cxx::__normal_iterator<deqp::egl::ChooseConfigRandomCase::AttribSpec*,std::vector<deqp::egl::ChooseConfigRandomCase::AttribSpec,std::allocator<deqp::egl::ChooseConfigRandomCase::AttribSpec>>>>
                      (rnd,(__normal_iterator<deqp::egl::ChooseConfigRandomCase::AttribSpec_*,_std::vector<deqp::egl::ChooseConfigRandomCase::AttribSpec,_std::allocator<deqp::egl::ChooseConfigRandomCase::AttribSpec>_>_>
                            )local_58._M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<deqp::egl::ChooseConfigRandomCase::AttribSpec_*,_std::vector<deqp::egl::ChooseConfigRandomCase::AttribSpec,_std::allocator<deqp::egl::ChooseConfigRandomCase::AttribSpec>_>_>
                        )local_58._M_impl.super__Vector_impl_data._M_finish);
    EVar1 = (*AVar6.getValue)(rnd);
    local_38.second = EVar1;
    local_38.first = AVar6.attribute;
    std::vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>>::
    emplace_back<std::pair<unsigned_int,int>>
              ((vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>> *)
               __return_storage_ptr__,&local_38);
  }
  std::
  _Vector_base<deqp::egl::ChooseConfigRandomCase::AttribSpec,_std::allocator<deqp::egl::ChooseConfigRandomCase::AttribSpec>_>
  ::~_Vector_base(&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<EGLenum, EGLint> > genRandomAttributes (const std::set<EGLenum>& attribSet, int numAttribs, de::Random& rnd)
	{
		static const struct AttribSpec attributes[] =
		{
			{ EGL_BUFFER_SIZE,				ChooseConfigRandomCase::getInt<0, 32>,		},
			{ EGL_RED_SIZE,					ChooseConfigRandomCase::getInt<0, 8>,		},
			{ EGL_GREEN_SIZE,				ChooseConfigRandomCase::getInt<0, 8>,		},
			{ EGL_BLUE_SIZE,				ChooseConfigRandomCase::getInt<0, 8>,		},
			{ EGL_LUMINANCE_SIZE,			ChooseConfigRandomCase::getInt<0, 1>,		},
			{ EGL_ALPHA_SIZE,				ChooseConfigRandomCase::getInt<0, 8>,		},
			{ EGL_ALPHA_MASK_SIZE,			ChooseConfigRandomCase::getInt<0, 1>,		},
			{ EGL_BIND_TO_TEXTURE_RGB,		ChooseConfigRandomCase::getBool,			},
			{ EGL_BIND_TO_TEXTURE_RGBA,		ChooseConfigRandomCase::getBool,			},
			{ EGL_COLOR_BUFFER_TYPE,		ChooseConfigRandomCase::getBufferType,		},
			{ EGL_CONFIG_CAVEAT,			ChooseConfigRandomCase::getConfigCaveat,	},
//			{ EGL_CONFIG_ID,				0/*special*/,		},
			{ EGL_CONFORMANT,				ChooseConfigRandomCase::getApiBits,			},
			{ EGL_DEPTH_SIZE,				ChooseConfigRandomCase::getInt<0, 32>,		},
			{ EGL_LEVEL,					ChooseConfigRandomCase::getInt<0, 1>,		},
//			{ EGL_MATCH_NATIVE_PIXMAP,		EGL_NONE,			},
			{ EGL_MAX_SWAP_INTERVAL,		ChooseConfigRandomCase::getInt<0, 2>,		},
			{ EGL_MIN_SWAP_INTERVAL,		ChooseConfigRandomCase::getInt<0, 1>,		},
			{ EGL_NATIVE_RENDERABLE,		ChooseConfigRandomCase::getBool,			},
//			{ EGL_NATIVE_VISUAL_TYPE,		EGL_DONT_CARE,		},
			{ EGL_RENDERABLE_TYPE,			ChooseConfigRandomCase::getApiBits,			},
			{ EGL_SAMPLE_BUFFERS,			ChooseConfigRandomCase::getInt<0, 1>,		},
			{ EGL_SAMPLES,					ChooseConfigRandomCase::getInt<0, 1>,		},
			{ EGL_STENCIL_SIZE,				ChooseConfigRandomCase::getInt<0, 1>,		},
			{ EGL_SURFACE_TYPE,				ChooseConfigRandomCase::getSurfaceType,		},
//			{ EGL_TRANSPARENT_TYPE,			EGL_TRANSPARENT_RGB,},
//			{ EGL_TRANSPARENT_RED_VALUE,	ChooseConfigRandomCase::getInt<0, 255>,		},
//			{ EGL_TRANSPARENT_GREEN_VALUE,	ChooseConfigRandomCase::getInt<0, 255>,		},
//			{ EGL_TRANSPARENT_BLUE_VALUE,	ChooseConfigRandomCase::getInt<0, 255>,		}
		};

		std::vector<std::pair<EGLenum, EGLint> > out;

		// Build list to select from
		std::vector<AttribSpec> candidates;
		for (int ndx = 0; ndx < (int)DE_LENGTH_OF_ARRAY(attributes); ndx++)
		{
			if (attribSet.find(attributes[ndx].attribute) != attribSet.end())
				candidates.push_back(attributes[ndx]);
		}

		for (int attribNdx = 0; attribNdx < numAttribs; attribNdx++)
		{
			AttribSpec spec = rnd.choose<AttribSpec>(candidates.begin(), candidates.end());
			out.push_back(std::make_pair(spec.attribute, spec.getValue(rnd)));
		}

		return out;
	}